

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O3

void __thiscall sznet::net::KcpTcpEventLoop::handleUdpRead(KcpTcpEventLoop *this,Timestamp param_1)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  sz_sock fd;
  _Rb_tree_color _Var3;
  size_t sVar4;
  bool bVar5;
  sockaddr *addr;
  sz_ssize_t sVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  SourceFile file;
  SourceFile file_00;
  Logger local_1008;
  int local_34 [2];
  int savedErrno;
  
  bVar5 = EventLoop::isInLoopThread(&this->super_EventLoop);
  if (!bVar5) {
    EventLoop::abortNotInLoopThread(&this->super_EventLoop);
  }
  local_34[0] = 0;
  do {
    fd = (this->m_udpSocket).m_sockfd;
    addr = sockets::sz_sockaddr_cast(&this->m_curRecvAddr);
    sVar6 = Buffer::recvFrom(&this->m_inputBuffer,fd,addr,local_34);
    if (sVar6 != -1) break;
  } while (local_34[0] == 4);
  if (sVar6 < 0) {
    bVar5 = sockets::sz_wouldblock();
    if (!bVar5) {
      file_00._8_8_ = 0x13;
      file_00.m_data = "KcpTcpEventLoop.cpp";
      Logger::Logger(&local_1008,file_00,0x7e,false);
      if (0x1e < (uint)(((int)&local_1008 + 0xfb0) - (int)local_1008.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1008.m_impl.m_stream.m_buffer.m_cur,"KcpTcpEventLoop::handleUdpRead",
                        0x1e);
        local_1008.m_impl.m_stream.m_buffer.m_cur = local_1008.m_impl.m_stream.m_buffer.m_cur + 0x1e
        ;
      }
      goto LAB_0012d780;
    }
  }
  else {
    (this->m_netStatInfo).m_recvBytes = (this->m_netStatInfo).m_recvBytes + sVar6;
  }
  if ((this->m_inputBuffer).m_writerIndex != (this->m_inputBuffer).m_readerIndex) {
    iVar7 = std::
            _Hashtable<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_addrConns)._M_h,&this->m_curRecvAddr);
    if ((iVar7.
         super__Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
         ._M_cur == (__node_type *)0x0) ||
       ((this->m_inputBuffer).m_writerIndex - (this->m_inputBuffer).m_readerIndex < 0x18)) {
      handleNewUdpMessage(this);
    }
    else {
      _Var3 = *(_Rb_tree_color *)
               (*(long *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_true>
                                ._M_cur + 0x18) + 0x40);
      p_Var1 = &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header;
      this->m_curConv = _Var3;
      p_Var9 = (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
      p_Var11 = p_Var1;
      if (p_Var9 != (_Base_ptr)0x0) {
        do {
          bVar5 = (_Rb_tree_color)*(size_t *)(p_Var9 + 1) < _Var3;
          if (!bVar5) {
            p_Var8 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar5];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
           (p_Var11 = (_Rb_tree_header *)p_Var8,
           _Var3 < (_Rb_tree_color)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var11 = p_Var1;
        }
      }
      p_Var9 = (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 = &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var2->_M_header;
      p_Var10 = &p_Var2->_M_header;
      if (p_Var9 != (_Base_ptr)0x0) {
        do {
          bVar5 = p_Var9[1]._M_color < _Var3;
          if (!bVar5) {
            p_Var10 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar5];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
           (p_Var8 = p_Var10, _Var3 < p_Var10[1]._M_color)) {
          p_Var8 = &p_Var2->_M_header;
        }
      }
      if (p_Var11 == p_Var1) {
        __assert_fail("fKcpIter != m_kcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x93,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if ((_Rb_tree_header *)p_Var8 == p_Var2) {
        __assert_fail("fTcpIter != m_tcpConnections.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x94,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if ((_Rb_tree_color)p_Var11->_M_node_count != p_Var8[1]._M_color) {
        __assert_fail("fKcpIter->first == fTcpIter->first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x95,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      if (((element_type *)p_Var8[1]._M_parent)->m_state != kConnected) {
        __assert_fail("fTcpIter->second->connected()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x96,"void sznet::net::KcpTcpEventLoop::handleUdpRead(Timestamp)");
      }
      (this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)p_Var8[1]._M_parent;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_curTcpConn).
                  super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var8[1]._M_left);
      (this->m_curKcpConn).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = *(element_type **)(p_Var11 + 1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_curKcpConn).
                  super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(p_Var11 + 1) + 8));
      handleKcpMessage(this);
    }
    sVar4 = (this->m_inputBuffer).m_nCheapPrepend;
    (this->m_inputBuffer).m_readerIndex = sVar4;
    (this->m_inputBuffer).m_writerIndex = sVar4;
    return;
  }
  file._8_8_ = 0x13;
  file.m_data = "KcpTcpEventLoop.cpp";
  Logger::Logger(&local_1008,file,0x85,ERROR);
  if (0x22 < (uint)(((int)&local_1008 + 0xfb0) - (int)local_1008.m_impl.m_stream.m_buffer.m_cur)) {
    builtin_strncpy(local_1008.m_impl.m_stream.m_buffer.m_cur,"m_inputBuffer.recvFrom return zero",
                    0x22);
    local_1008.m_impl.m_stream.m_buffer.m_cur = local_1008.m_impl.m_stream.m_buffer.m_cur + 0x22;
  }
LAB_0012d780:
  Logger::~Logger(&local_1008);
  return;
}

Assistant:

void KcpTcpEventLoop::handleUdpRead(Timestamp)
{
	assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	do
	{
		n = m_inputBuffer.recvFrom(m_udpSocket.fd(), sockets::sz_sockaddr_cast(&m_curRecvAddr), &savedErrno);
	} while (n == -1 && savedErrno == sz_err_eintr);
	if (n >= 0)
	{
		m_netStatInfo.m_recvBytes += n;
	}
	else
	{
		if (!sockets::sz_wouldblock())
		{
			LOG_SYSERR << "KcpTcpEventLoop::handleUdpRead";
			return;
		}
	}

	if (m_inputBuffer.readableBytes() == 0)
	{
		LOG_ERROR << "m_inputBuffer.recvFrom return zero";
		return;
	}
	// 需要考虑客户端与服务器异步原因造成，回执结果丢包 | 客户端收到前超时再次发送握手校验
	auto fAddrConnIter = m_addrConns.find(m_curRecvAddr);
	if (fAddrConnIter == m_addrConns.end() || m_inputBuffer.readableBytes() < KcpConnection::kKCP_OVERHEAD_SIZE)
	{
		handleNewUdpMessage();
		m_inputBuffer.retrieveAll();
		return;
	}
	m_curConv = fAddrConnIter->second->getConvId();
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(m_curConv);
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(m_curConv);
	assert(fKcpIter != m_kcpConnections.end());
	assert(fTcpIter != m_tcpConnections.end());
	assert(fKcpIter->first == fTcpIter->first);
	assert(fTcpIter->second->connected());
	m_curTcpConn = fTcpIter->second;
	m_curKcpConn = fKcpIter->second;
	handleKcpMessage();
	m_inputBuffer.retrieveAll();
}